

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O2

void __thiscall antlr::Parser::Parser(Parser *this,TokenBuffer *input)

{
  ParserInputState *p;
  
  this->_vptr_Parser = (_func_int **)&PTR__Parser_002c76e8;
  p = (ParserInputState *)operator_new(0x40);
  p->_vptr_ParserInputState = (_func_int **)&PTR__ParserInputState_002c7518;
  p->guessing = 0;
  (p->filename)._M_dataplus._M_p = (pointer)&(p->filename).field_2;
  (p->filename)._M_string_length = 0;
  (p->filename).field_2._M_local_buf[0] = '\0';
  p->input = input;
  p->inputResponsible = true;
  RefCount<antlr::ParserInputState>::RefCount(&this->inputState,p);
  this->astFactory = (ASTFactory *)0x0;
  this->traceDepth = 0;
  return;
}

Assistant:

Parser(TokenBuffer* input)
	: inputState(new ParserInputState(input)), astFactory(0), traceDepth(0)
	{
	}